

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

void proto3_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  int iVar2;
  MessageLite *pMVar3;
  long lVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  void *pvVar7;
  Arena *pAVar8;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *psVar9;
  InternalMetadata *this;
  Arena *arena;
  _Alloc_hider local_48;
  undefined8 local_38;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    psVar9 = (string *)to_msg;
    MergeImpl();
    goto LAB_00cedf35;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 3),(RepeatedField<long> *)(from_msg + 3));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)&to_msg[4]._internal_metadata_,
             (RepeatedField<unsigned_int> *)&from_msg[4]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)(to_msg + 6),
             (RepeatedField<unsigned_long> *)(from_msg + 6));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[7]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[7]._internal_metadata_);
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 9),(RepeatedField<long> *)(from_msg + 9));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)&to_msg[10]._internal_metadata_,
             (RepeatedField<unsigned_int> *)&from_msg[10]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)&to_msg[0xb]._internal_metadata_,
             (RepeatedField<unsigned_long> *)&from_msg[0xb]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[0xc]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[0xc]._internal_metadata_);
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)&to_msg[0xd]._internal_metadata_,
             (RepeatedField<long> *)&from_msg[0xd]._internal_metadata_);
  google::protobuf::RepeatedField<float>::MergeFrom
            ((RepeatedField<float> *)&to_msg[0xe]._internal_metadata_,
             (RepeatedField<float> *)&from_msg[0xe]._internal_metadata_);
  google::protobuf::RepeatedField<double>::MergeFrom
            ((RepeatedField<double> *)&to_msg[0xf]._internal_metadata_,
             (RepeatedField<double> *)&from_msg[0xf]._internal_metadata_);
  google::protobuf::RepeatedField<bool>::MergeFrom
            ((RepeatedField<bool> *)&to_msg[0x10]._internal_metadata_,
             (RepeatedField<bool> *)&from_msg[0x10]._internal_metadata_);
  if (*(int *)&from_msg[0x12]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x11]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x11]._internal_metadata_);
  }
  if ((int)from_msg[0x13]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0x13),(RepeatedPtrFieldBase *)(from_msg + 0x13));
  }
  if (*(int *)&from_msg[0x15]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[0x14]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x14]._internal_metadata_,
               google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>);
  }
  if ((int)from_msg[0x16]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 0x16),(RepeatedPtrFieldBase *)(from_msg + 0x16),
               google::protobuf::Arena::CopyConstruct<proto3_unittest::ForeignMessage>);
  }
  if (*(int *)&from_msg[0x18]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[0x17]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x17]._internal_metadata_,
               google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>);
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0x19),(RepeatedField<int> *)(from_msg + 0x19));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[0x1a]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[0x1a]._internal_metadata_);
  if ((int)from_msg[0x1c]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0x1c),(RepeatedPtrFieldBase *)(from_msg + 0x1c));
  }
  if (*(int *)&from_msg[0x1e]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x1d]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x1d]._internal_metadata_);
  }
  if ((int)from_msg[0x1f]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 0x1f),(RepeatedPtrFieldBase *)(from_msg + 0x1f),
               google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>);
  }
  unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)unaff_EBP == '\0') goto LAB_00cedbc0;
  if ((unaff_EBP & 1) == 0) goto LAB_00ced91f;
  psVar9 = (string *)(from_msg[0x20]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if (((InternalMetadata *)&psVar9->_M_string_length)->ptr_ == 0) {
    if ((to_msg[0x20]._internal_metadata_.ptr_ & 3) != 0) goto LAB_00ced91f;
    local_48._M_p = (pointer)&stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
    *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
    pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x20]._internal_metadata_,
               (string *)&stack0xffffffffffffffb8,pAVar8);
    if (local_48._M_p == (pointer)&stack0xffffffffffffffc8) goto LAB_00ced91f;
    operator_delete(local_48._M_p,local_38 + 1);
    goto LAB_00ced91f;
  }
  *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
  this = &to_msg[0x20]._internal_metadata_;
  pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)pAVar8 & 1) != 0) goto LAB_00cedf6d;
  do {
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,psVar9,pAVar8);
LAB_00ced91f:
    if ((unaff_EBP & 2) != 0) {
      psVar9 = (string *)((ulong)from_msg[0x21]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar9->_M_string_length == 0) {
        if (((ulong)to_msg[0x21]._vptr_MessageLite & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
          pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)(to_msg + 0x21),(string *)&stack0xffffffffffffffb8,pAVar8);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
        pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 0x21),psVar9,pAVar8);
      }
    }
    if ((unaff_EBP & 4) != 0) {
      psVar9 = (string *)(from_msg[0x21]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar9->_M_string_length == 0) {
        if ((to_msg[0x21]._internal_metadata_.ptr_ & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
          pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[0x21]._internal_metadata_,
                     (string *)&stack0xffffffffffffffb8,pAVar8);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
        pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[0x21]._internal_metadata_,psVar9,pAVar8);
      }
    }
    if ((unaff_EBP & 8) != 0) {
      psVar9 = (string *)((ulong)from_msg[0x22]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar9->_M_string_length == 0) {
        if (((ulong)to_msg[0x22]._vptr_MessageLite & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
          pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)(to_msg + 0x22),(string *)&stack0xffffffffffffffb8,pAVar8);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
        pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 0x22),psVar9,pAVar8);
      }
    }
    if ((unaff_EBP & 0x10) == 0) {
LAB_00cedb19:
      if ((unaff_EBP & 0x20) != 0) {
        psVar9 = (string *)from_msg[0x23]._vptr_MessageLite;
        if (psVar9 == (string *)0x0) goto LAB_00cedf3d;
        if ((MessageLite *)to_msg[0x23]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var6 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<proto3_unittest::ForeignMessage>
                              (arena,psVar9);
          to_msg[0x23]._vptr_MessageLite = pp_Var6;
        }
        else {
          ForeignMessage::MergeImpl
                    ((MessageLite *)to_msg[0x23]._vptr_MessageLite,(MessageLite *)psVar9);
        }
      }
      if ((unaff_EBP & 0x40) != 0) {
        psVar9 = (string *)from_msg[0x23]._internal_metadata_.ptr_;
        if (psVar9 == (string *)0x0) goto LAB_00cedf45;
        pMVar3 = (MessageLite *)to_msg[0x23]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar7 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                             (arena,psVar9);
          to_msg[0x23]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
        }
        else {
          proto2_unittest_import::ImportMessage::MergeImpl(pMVar3,(MessageLite *)psVar9);
        }
      }
      if ((char)unaff_EBP < '\0') {
        psVar9 = (string *)from_msg[0x24]._vptr_MessageLite;
        if (psVar9 != (string *)0x0) {
          if ((MessageLite *)to_msg[0x24]._vptr_MessageLite == (MessageLite *)0x0) {
            pp_Var6 = (_func_int **)
                      google::protobuf::Arena::
                      CopyConstruct<proto2_unittest_import::PublicImportMessage>(arena,psVar9);
            to_msg[0x24]._vptr_MessageLite = pp_Var6;
          }
          else {
            proto2_unittest_import::PublicImportMessage::MergeImpl
                      ((MessageLite *)to_msg[0x24]._vptr_MessageLite,(MessageLite *)psVar9);
          }
          goto LAB_00cedbc0;
        }
        goto LAB_00cedf55;
      }
LAB_00cedbc0:
      if ((unaff_EBP & 0xff00) == 0) goto LAB_00cedcec;
      if ((unaff_EBP >> 8 & 1) != 0) {
        psVar9 = (string *)from_msg[0x24]._internal_metadata_.ptr_;
        if (psVar9 == (string *)0x0) goto LAB_00cedf4d;
        pMVar3 = (MessageLite *)to_msg[0x24]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar7 = google::protobuf::Arena::
                   CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>(arena,psVar9);
          to_msg[0x24]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
        }
        else {
          TestAllTypes_NestedMessage::MergeImpl(pMVar3,(MessageLite *)psVar9);
        }
      }
      if ((unaff_EBP >> 9 & 1) != 0) {
        psVar9 = (string *)from_msg[0x25]._vptr_MessageLite;
        if (psVar9 != (string *)0x0) {
          if ((MessageLite *)to_msg[0x25]._vptr_MessageLite == (MessageLite *)0x0) {
            pp_Var6 = (_func_int **)
                      google::protobuf::Arena::
                      CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>(arena,psVar9);
            to_msg[0x25]._vptr_MessageLite = pp_Var6;
          }
          else {
            TestAllTypes_NestedMessage::MergeImpl
                      ((MessageLite *)to_msg[0x25]._vptr_MessageLite,(MessageLite *)psVar9);
          }
          goto LAB_00cedc3c;
        }
        goto LAB_00cedf5d;
      }
LAB_00cedc3c:
      if ((unaff_EBP >> 10 & 1) == 0) goto LAB_00cedc74;
      psVar9 = (string *)from_msg[0x25]._internal_metadata_.ptr_;
      if (psVar9 != (string *)0x0) break;
    }
    else {
      psVar9 = (string *)from_msg[0x22]._internal_metadata_.ptr_;
      if (psVar9 != (string *)0x0) {
        pMVar3 = (MessageLite *)to_msg[0x22]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar7 = google::protobuf::Arena::
                   CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>(arena,psVar9);
          to_msg[0x22]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
        }
        else {
          TestAllTypes_NestedMessage::MergeImpl(pMVar3,(MessageLite *)psVar9);
        }
        goto LAB_00cedb19;
      }
LAB_00cedf35:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cedf3d:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cedf45:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cedf4d:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cedf55:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cedf5d:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
    }
    this = (InternalMetadata *)&stack0xffffffffffffffb8;
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
    pAVar8 = extraout_RDX;
LAB_00cedf6d:
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  } while( true );
  pMVar3 = (MessageLite *)to_msg[0x25]._internal_metadata_.ptr_;
  if (pMVar3 == (MessageLite *)0x0) {
    pvVar7 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                       (arena,psVar9);
    to_msg[0x25]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
  }
  else {
    proto2_unittest_import::ImportMessage::MergeImpl(pMVar3,(MessageLite *)psVar9);
  }
LAB_00cedc74:
  if (((unaff_EBP >> 0xb & 1) != 0) && (from_msg[0x26]._vptr_MessageLite != (_func_int **)0x0)) {
    to_msg[0x26]._vptr_MessageLite = from_msg[0x26]._vptr_MessageLite;
  }
  if (((unaff_EBP >> 0xc & 1) != 0) &&
     (iVar1 = (int)from_msg[0x26]._internal_metadata_.ptr_, iVar1 != 0)) {
    *(int *)&to_msg[0x26]._internal_metadata_.ptr_ = iVar1;
  }
  if (((unaff_EBP >> 0xd & 1) != 0) &&
     (iVar1 = *(int *)((long)&from_msg[0x26]._internal_metadata_.ptr_ + 4), iVar1 != 0)) {
    *(int *)((long)&to_msg[0x26]._internal_metadata_.ptr_ + 4) = iVar1;
  }
  if (((unaff_EBP >> 0xe & 1) != 0) && (from_msg[0x27]._vptr_MessageLite != (_func_int **)0x0)) {
    to_msg[0x27]._vptr_MessageLite = from_msg[0x27]._vptr_MessageLite;
  }
  if (((short)unaff_EBP < 0) && (lVar4 = from_msg[0x27]._internal_metadata_.ptr_, lVar4 != 0)) {
    to_msg[0x27]._internal_metadata_.ptr_ = lVar4;
  }
LAB_00cedcec:
  if ((unaff_EBP & 0xff0000) != 0) {
    if (((unaff_EBP >> 0x10 & 1) != 0) && (*(int *)&from_msg[0x28]._vptr_MessageLite != 0)) {
      *(int *)&to_msg[0x28]._vptr_MessageLite = *(int *)&from_msg[0x28]._vptr_MessageLite;
    }
    if (((unaff_EBP >> 0x11 & 1) != 0) &&
       (iVar1 = *(int *)((long)&from_msg[0x28]._vptr_MessageLite + 4), iVar1 != 0)) {
      *(int *)((long)&to_msg[0x28]._vptr_MessageLite + 4) = iVar1;
    }
    if (((unaff_EBP >> 0x12 & 1) != 0) &&
       (lVar4 = from_msg[0x28]._internal_metadata_.ptr_, lVar4 != 0)) {
      to_msg[0x28]._internal_metadata_.ptr_ = lVar4;
    }
    if (((unaff_EBP >> 0x13 & 1) != 0) && (from_msg[0x29]._vptr_MessageLite != (_func_int **)0x0)) {
      to_msg[0x29]._vptr_MessageLite = from_msg[0x29]._vptr_MessageLite;
    }
    if (((unaff_EBP >> 0x14 & 1) != 0) &&
       (iVar1 = (int)from_msg[0x29]._internal_metadata_.ptr_, iVar1 != 0)) {
      *(int *)&to_msg[0x29]._internal_metadata_.ptr_ = iVar1;
    }
    if (((unaff_EBP >> 0x15 & 1) != 0) &&
       (iVar1 = *(int *)((long)&from_msg[0x29]._internal_metadata_.ptr_ + 4), iVar1 != 0)) {
      *(int *)((long)&to_msg[0x29]._internal_metadata_.ptr_ + 4) = iVar1;
    }
    if (((unaff_EBP >> 0x16 & 1) != 0) && (from_msg[0x2a]._vptr_MessageLite != (_func_int **)0x0)) {
      to_msg[0x2a]._vptr_MessageLite = from_msg[0x2a]._vptr_MessageLite;
    }
    if (((unaff_EBP >> 0x17 & 1) != 0) && ((char)from_msg[0x2a]._internal_metadata_.ptr_ == '\x01'))
    {
      *(undefined1 *)&to_msg[0x2a]._internal_metadata_.ptr_ = 1;
    }
  }
  if ((unaff_EBP & 0x3000000) != 0) {
    if (((unaff_EBP >> 0x18 & 1) != 0) &&
       (iVar1 = *(int *)((long)&from_msg[0x2a]._internal_metadata_.ptr_ + 4), iVar1 != 0)) {
      *(int *)((long)&to_msg[0x2a]._internal_metadata_.ptr_ + 4) = iVar1;
    }
    if (((unaff_EBP >> 0x19 & 1) != 0) && (*(int *)&from_msg[0x2b]._vptr_MessageLite != 0)) {
      *(int *)&to_msg[0x2b]._vptr_MessageLite = *(int *)&from_msg[0x2b]._vptr_MessageLite;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  iVar1 = *(int *)&from_msg[0x2c]._vptr_MessageLite;
  if (iVar1 == 0) goto switchD_00cede49_default;
  iVar2 = *(int *)&to_msg[0x2c]._vptr_MessageLite;
  if (iVar2 != iVar1) {
    if (iVar2 != 0) {
      clear_oneof_field((TestAllTypes *)to_msg);
    }
    *(int *)&to_msg[0x2c]._vptr_MessageLite = iVar1;
  }
  switch(iVar1) {
  case 0x6f:
    *(int *)&to_msg[0x2b]._internal_metadata_.ptr_ = (int)from_msg[0x2b]._internal_metadata_.ptr_;
    break;
  case 0x70:
    if (iVar2 == iVar1) {
      TestAllTypes_NestedMessage::MergeImpl
                ((MessageLite *)to_msg[0x2b]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[0x2b]._internal_metadata_.ptr_);
    }
    else {
      pvVar7 = google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes_NestedMessage>
                         (arena,(void *)from_msg[0x2b]._internal_metadata_.ptr_);
      to_msg[0x2b]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
    }
    break;
  case 0x71:
    if (iVar2 != iVar1) {
      to_msg[0x2b]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x2c]._vptr_MessageLite == 0x71) goto LAB_00cedeab;
LAB_00cede7e:
    psVar9 = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_00cedeb6;
  case 0x72:
    if (iVar2 != iVar1) {
      to_msg[0x2b]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x2c]._vptr_MessageLite != 0x72) goto LAB_00cede7e;
LAB_00cedeab:
    psVar9 = (string *)(from_msg[0x2b]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_00cedeb6:
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x2b]._internal_metadata_,psVar9,arena);
  }
switchD_00cede49_default:
  uVar5 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_optional_string().empty()) {
        _this->_internal_set_optional_string(from._internal_optional_string());
      } else {
        if (_this->_impl_.optional_string_.IsDefault()) {
          _this->_internal_set_optional_string("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_optional_bytes().empty()) {
        _this->_internal_set_optional_bytes(from._internal_optional_bytes());
      } else {
        if (_this->_impl_.optional_bytes_.IsDefault()) {
          _this->_internal_set_optional_bytes("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_optional_string_piece().empty()) {
        _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
      } else {
        if (_this->_impl_.optional_string_piece_.IsDefault()) {
          _this->_internal_set_optional_string_piece("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_optional_cord().empty()) {
        _this->_internal_set_optional_cord(from._internal_optional_cord());
      } else {
        if (_this->_impl_.optional_cord_.IsDefault()) {
          _this->_internal_set_optional_cord("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_import_message_ != nullptr);
      if (_this->_impl_.optional_lazy_import_message_ == nullptr) {
        _this->_impl_.optional_lazy_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_import_message_);
      } else {
        _this->_impl_.optional_lazy_import_message_->MergeFrom(*from._impl_.optional_lazy_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_optional_int64() != 0) {
        _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_optional_int32() != 0) {
        _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_optional_uint32() != 0) {
        _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_optional_uint64() != 0) {
        _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_optional_sint64() != 0) {
        _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_optional_sint32() != 0) {
        _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_optional_fixed32() != 0) {
        _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_optional_fixed64() != 0) {
        _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_optional_sfixed64() != 0) {
        _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_optional_sfixed32() != 0) {
        _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(from._internal_optional_float()) != 0) {
        _this->_impl_.optional_float_ = from._impl_.optional_float_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(from._internal_optional_double()) != 0) {
        _this->_impl_.optional_double_ = from._impl_.optional_double_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_optional_bool() != 0) {
        _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
      }
    }
  }
  if ((cached_has_bits & 0x03000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_optional_nested_enum() != 0) {
        _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_optional_foreign_enum() != 0) {
        _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}